

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Man_t * Saig_ManWindowExtractMiter(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  int local_58;
  int local_54;
  int nRegCount;
  int i;
  Vec_Ptr_t *vNodes1;
  Vec_Ptr_t *vNodes0;
  Aig_Obj_t *pMatch1;
  Aig_Obj_t *pMatch0;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *pNew;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  for (local_54 = 0; iVar1 = Saig_ManPoNum(p0), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,local_54);
    pAVar7 = Aig_ManCo(p1,local_54);
    Aig_ObjSetRepr(p0,pAVar3,pAVar7);
    Aig_ObjSetRepr(p1,pAVar7,pAVar3);
  }
  local_54 = 0;
  do {
    iVar1 = Saig_ManRegNum(p0);
    if (iVar1 <= local_54) {
      Aig_ManCleanData(p0);
      Aig_ManCleanData(p1);
      pVVar5 = Saig_ManCollectedDiffNodes(p0,p1);
      p = Saig_ManCollectedDiffNodes(p1,p0);
      iVar1 = Vec_PtrSize(pVVar5);
      iVar2 = Vec_PtrSize(p);
      p_00 = Aig_ManStart(iVar1 + iVar2);
      pcVar6 = Abc_UtilStrsav("wnd");
      p_00->pName = pcVar6;
      p_00->pSpec = (char *)0x0;
      pAVar3 = Aig_ManConst1(p0);
      pAVar7 = Aig_ManConst1(p_00);
      (pAVar3->field_5).pData = pAVar7;
      pAVar3 = Aig_ManConst1(p1);
      pAVar7 = Aig_ManConst1(p_00);
      (pAVar3->field_5).pData = pAVar7;
      Saig_ManWindowCreatePis(p_00,p0,p1,pVVar5);
      Saig_ManWindowCreatePis(p_00,p1,p0,p);
      for (local_54 = 0; iVar1 = Vec_PtrSize(pVVar5), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_54);
        iVar1 = Saig_ObjIsLo(p0,pAVar3);
        if (iVar1 != 0) {
          pAVar7 = Aig_ObjCreateCi(p_00);
          (pAVar3->field_5).pData = pAVar7;
        }
      }
      for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_54);
        iVar1 = Saig_ObjIsLo(p1,pAVar3);
        if (iVar1 != 0) {
          pAVar7 = Aig_ObjCreateCi(p_00);
          (pAVar3->field_5).pData = pAVar7;
        }
      }
      for (local_54 = 0; iVar1 = Vec_PtrSize(pVVar5), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_54);
        iVar1 = Aig_ObjIsNode(pAVar3);
        if (iVar1 != 0) {
          pAVar7 = Aig_ObjChild0Copy(pAVar3);
          pAVar8 = Aig_ObjChild1Copy(pAVar3);
          pAVar7 = Aig_And(p_00,pAVar7,pAVar8);
          (pAVar3->field_5).pData = pAVar7;
        }
      }
      for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_54);
        iVar1 = Aig_ObjIsNode(pAVar3);
        if (iVar1 != 0) {
          pAVar7 = Aig_ObjChild0Copy(pAVar3);
          pAVar8 = Aig_ObjChild1Copy(pAVar3);
          pAVar7 = Aig_And(p_00,pAVar7,pAVar8);
          (pAVar3->field_5).pData = pAVar7;
        }
      }
      Saig_ManWindowCreatePos(p_00,p0,p1);
      local_58 = 0;
      for (local_54 = 0; iVar1 = Vec_PtrSize(pVVar5), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_54);
        iVar1 = Saig_ObjIsLo(p0,pAVar3);
        if (iVar1 != 0) {
          pAVar3 = Saig_ObjLoToLi(p0,pAVar3);
          pAVar3 = Aig_ObjChild0Copy(pAVar3);
          Aig_ObjCreateCo(p_00,pAVar3);
          local_58 = local_58 + 1;
        }
      }
      for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_54);
        iVar1 = Saig_ObjIsLo(p1,pAVar3);
        if (iVar1 != 0) {
          pAVar3 = Saig_ObjLoToLi(p1,pAVar3);
          pAVar3 = Aig_ObjChild0Copy(pAVar3);
          Aig_ObjCreateCo(p_00,pAVar3);
          local_58 = local_58 + 1;
        }
      }
      Aig_ManSetRegNum(p_00,local_58);
      Aig_ManCleanup(p_00);
      Vec_PtrFree(pVVar5);
      Vec_PtrFree(p);
      return p_00;
    }
    pVVar5 = p0->vCos;
    iVar1 = Saig_ManPoNum(p0);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,local_54 + iVar1);
    pAVar7 = Saig_ObjLiToLo(p0,pAVar3);
    pAVar8 = Aig_ObjRepr(p0,pAVar7);
    if (pAVar8 != (Aig_Obj_t *)0x0) {
      pAVar4 = Aig_ObjRepr(p1,pAVar8);
      if (pAVar7 != pAVar4) {
        __assert_fail("pMatch0 == Aig_ObjRepr( p1, pMatch1 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x2df,"Aig_Man_t *Saig_ManWindowExtractMiter(Aig_Man_t *, Aig_Man_t *)");
      }
      pAVar7 = Saig_ObjLoToLi(p1,pAVar8);
      Aig_ObjSetRepr(p0,pAVar3,pAVar7);
      Aig_ObjSetRepr(p1,pAVar7,pAVar3);
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj0, * pObj1, * pMatch0, * pMatch1;
    Vec_Ptr_t * vNodes0, * vNodes1;
    int i, nRegCount;
    // add matching of POs and LIs
    Saig_ManForEachPo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    Saig_ManForEachLi( p0, pObj0, i )
    {
        pMatch0 = Saig_ObjLiToLo( p0, pObj0 );
        pMatch1 = Aig_ObjRepr( p0, pMatch0 );
        if ( pMatch1 == NULL )
            continue;
        assert( pMatch0 == Aig_ObjRepr( p1, pMatch1 ) );
        pObj1 = Saig_ObjLoToLi( p1, pMatch1 );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    // clean the markings
    Aig_ManCleanData( p0 ); 
    Aig_ManCleanData( p1 ); 
    // collect nodes that are not linked
    vNodes0 = Saig_ManCollectedDiffNodes( p0, p1 );
    vNodes1 = Saig_ManCollectedDiffNodes( p1, p0 );
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes0) + Vec_PtrSize(vNodes1) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj0 = Aig_ManConst1( p0 );
    pObj0->pData = Aig_ManConst1( pNew );
    pObj1 = Aig_ManConst1( p1 );
    pObj1->pData = Aig_ManConst1( pNew );
    // create real PIs
    Saig_ManWindowCreatePis( pNew, p0, p1, vNodes0 );
    Saig_ManWindowCreatePis( pNew, p1, p0, vNodes1 );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
            pObj0->pData = Aig_ObjCreateCi(pNew);
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
            pObj1->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Aig_ObjIsNode(pObj0) )
            pObj0->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Aig_ObjIsNode(pObj1) )
            pObj1->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj1), Aig_ObjChild1Copy(pObj1) );
    }
    // create POs
    Saig_ManWindowCreatePos( pNew, p0, p1 );
//    Saig_ManWindowCreatePos( pNew, p1, p0 );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
        {
            pMatch0 = Saig_ObjLoToLi( p0, pObj0 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch0) );
            nRegCount++;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
        {
            pMatch1 = Saig_ObjLoToLi( p1, pObj1 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch1) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    Vec_PtrFree( vNodes0 );
    Vec_PtrFree( vNodes1 );
    return pNew;
}